

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::Decode
          (Directed_Energy_Fire_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  StandardVariable *this_01;
  int iVar3;
  KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> local_98;
  KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> local_80;
  StandardVariable *local_68;
  StandardVariable *p;
  KUINT32 datumID;
  KUINT16 pos;
  KUINT16 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Directed_Energy_Fire_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x58) {
    datumID._3_1_ = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    datumID._3_1_ = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::clear(&this->m_vDeRec);
  Header7::Decode(&this->super_Header,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)&this->m_FiringEntityID);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,(DataTypeBase *)&this->m_EventID);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_MunTyp).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_ShotStartTime).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32CumulativeShotTime);
  pKVar2 = DATA_TYPE::operator>>(pKVar2,&(this->m_EmitterLoc).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32AperDiameter);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32Wavelength);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32PeakIrradiance);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32PulseRepFreq);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32PulseWidth);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->m_DeUnion).m_ui16Flags);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8PulseShp);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8Padding1);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32Padding2);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding3);
  KDataStream::operator>>(pKVar2,&this->m_ui16NumDERecs);
  for (datumID._0_2_ = 0; (ushort)datumID < this->m_ui16NumDERecs;
      datumID._0_2_ = (ushort)datumID + 1) {
    p._6_2_ = KDataStream::GetCurrentWritePosition(pKStack_18);
    KDataStream::operator>>(pKStack_18,(uint *)&p);
    KDataStream::SetCurrentWritePosition(pKStack_18,p._6_2_);
    local_68 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode
                         ((KINT32)p,pKStack_18);
    if (local_68 == (StandardVariable *)0x0) {
      this_01 = (StandardVariable *)operator_new(0x10);
      DATA_TYPE::StandardVariable::StandardVariable(this_01,pKStack_18);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::KRef_Ptr(&local_98,this_01);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
      ::push_back(&this->m_vDeRec,&local_98);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::~KRef_Ptr(&local_98);
    }
    else {
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::KRef_Ptr(&local_80,local_68);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
      ::push_back(&this->m_vDeRec,&local_80);
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::~KRef_Ptr(&local_80);
    }
  }
  return;
}

Assistant:

void Directed_Energy_Fire_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DIRECTED_ENERGY_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vDeRec.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_FiringEntityID
           >> KDIS_STREAM m_EventID
           >> KDIS_STREAM m_MunTyp
           >> KDIS_STREAM m_ShotStartTime
           >> m_f32CumulativeShotTime
           >> KDIS_STREAM m_EmitterLoc
           >> m_f32AperDiameter
           >> m_f32Wavelength
           >> m_f32PeakIrradiance
           >> m_f32PulseRepFreq
           >> m_f32PulseWidth
           >> m_DeUnion.m_ui16Flags
           >> m_ui8PulseShp
           >> m_ui8Padding1
           >> m_ui32Padding2
           >> m_ui16Padding3
           >> m_ui16NumDERecs;

    for( KUINT16 i = 0; i < m_ui16NumDERecs; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        StandardVariable * p = StandardVariable::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vDeRec.push_back( StdVarPtr( p ) );
        }
        else
        {
            // Default
            m_vDeRec.push_back( StdVarPtr( new StandardVariable( stream ) ) );
        }
    }
}